

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O2

Offset wabt::WriteU32Leb128Raw(uint8_t *dest,uint8_t *dest_end,uint32_t value)

{
  ulong uVar1;
  Offset __n;
  uint8_t data [5];
  byte local_d [5];
  
  uVar1 = 0;
  for (; 0x7f < value; value = value >> 7) {
    local_d[uVar1] = (byte)value | 0x80;
    uVar1 = uVar1 + 1;
  }
  local_d[uVar1] = (byte)value;
  if (uVar1 < (ulong)((long)dest_end - (long)dest)) {
    __n = uVar1 + 1;
    memcpy(dest,local_d,__n);
  }
  else {
    __n = 0;
  }
  return __n;
}

Assistant:

Offset WriteU32Leb128Raw(uint8_t* dest, uint8_t* dest_end, uint32_t value) {
  uint8_t data[MAX_U32_LEB128_BYTES];
  Offset length = 0;
  LEB128_LOOP_UNTIL(value == 0);
  if (static_cast<Offset>(dest_end - dest) < length) {
    return 0;
  }
  memcpy(dest, data, length);
  return length;
}